

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_unittests.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_43f2::NormaliseColorTest_multi_channel_test_Test::TestBody
          (NormaliseColorTest_multi_channel_test_Test *this)

{
  color<unsigned_int,_4U> input;
  color<unsigned_int,_4U> input_00;
  color<unsigned_int,_4U> output;
  color<unsigned_int,_4U> output_00;
  color<unsigned_int,_4U> output_01;
  color<unsigned_int,_3U> output_02;
  color<unsigned_int,_3U> output_03;
  color<unsigned_int,_3U> output_04;
  color<unsigned_int,_3U> input_01;
  color<unsigned_int,_3U> input_02;
  
  (anonymous_namespace)::test_color<color<unsigned_char,4u>>
            ((color<unsigned_char,_4U>)0x0,(color<unsigned_char,_4U>)0x363636);
  (anonymous_namespace)::test_color<color<unsigned_char,4u>>
            ((color<unsigned_char,_4U>)0xffffffff,(color<unsigned_char,_4U>)0xffc9c9c9);
  (anonymous_namespace)::test_color<color<unsigned_char,4u>>
            ((color<unsigned_char,_4U>)0xb2bf1f,(color<unsigned_char,_4U>)0xb3c01e);
  (anonymous_namespace)::test_color<color<unsigned_short,4u>>
            ((color<unsigned_short,_4U>)0x0,(color<unsigned_short,_4U>)0x361936193619);
  (anonymous_namespace)::test_color<color<unsigned_short,4u>>
            ((color<unsigned_short,_4U>)0xffffffffffffffff,
             (color<unsigned_short,_4U>)0xffffc9e6c9e6c9e6);
  (anonymous_namespace)::test_color<color<unsigned_short,4u>>
            ((color<unsigned_short,_4U>)0xb200bf001f,(color<unsigned_short,_4U>)0x3633363b35de);
  output.field_0._8_8_ = 0x36196300;
  output.field_0._0_8_ = 0x3619630036196300;
  (anonymous_namespace)::test_color<color<unsigned_int,4u>>
            ((color<unsigned_int,_4U>)ZEXT816(0),output);
  input.field_0._8_8_ = 0xffffffffffffffff;
  input.field_0._0_8_ = 0xffffffffffffffff;
  output_00.field_0._8_8_ = 0xffffffffc9e69d00;
  output_00.field_0._0_8_ = 0xc9e69d00c9e69d00;
  (anonymous_namespace)::test_color<color<unsigned_int,4u>>(input,output_00);
  input_00.field_0._8_8_ = 0xb2;
  input_00.field_0._0_8_ = 0xbf0000001f;
  output_01.field_0._8_8_ = 0x36196300;
  output_01.field_0._0_8_ = 0x3619630036196300;
  (anonymous_namespace)::test_color<color<unsigned_int,4u>>(input_00,output_01);
  (anonymous_namespace)::test_color<color<unsigned_char,3u>>
            ((color<unsigned_char,_3U>)0x0,(color<unsigned_char,_3U>)0x363636);
  (anonymous_namespace)::test_color<color<unsigned_char,3u>>
            ((color<unsigned_char,_3U>)0xffffff,(color<unsigned_char,_3U>)0xc9c9c9);
  (anonymous_namespace)::test_color<color<unsigned_char,3u>>
            ((color<unsigned_char,_3U>)0xb2bf1f,(color<unsigned_char,_3U>)0xb3c01e);
  (anonymous_namespace)::test_color<color<unsigned_short,3u>>
            ((color<unsigned_short,_3U>)0x0,(color<unsigned_short,_3U>)0x361936193619);
  (anonymous_namespace)::test_color<color<unsigned_short,3u>>
            ((color<unsigned_short,_3U>)0xffffffffffff,(color<unsigned_short,_3U>)0xc9e6c9e6c9e6);
  (anonymous_namespace)::test_color<color<unsigned_short,3u>>
            ((color<unsigned_short,_3U>)0xb200bf001f,(color<unsigned_short,_3U>)0x3633363b35de);
  output_02.field_0.comps[2] = 0x36196300;
  output_02.field_0._0_8_ = 0x3619630036196300;
  (anonymous_namespace)::test_color<color<unsigned_int,3u>>
            ((color<unsigned_int,_3U>)ZEXT812(0),output_02);
  output_03.field_0.comps[2] = 0xc9e69d00;
  output_03.field_0._0_8_ = 0xc9e69d00c9e69d00;
  input_01.field_0.comps[2] = 0xffffffff;
  input_01.field_0._0_8_ = 0xffffffffffffffff;
  (anonymous_namespace)::test_color<color<unsigned_int,3u>>(input_01,output_03);
  output_04.field_0.comps[2] = 0x36196300;
  output_04.field_0._0_8_ = 0x3619630036196300;
  input_02.field_0.comps[2] = 0xb2;
  input_02.field_0._0_8_ = 0xbf0000001f;
  (anonymous_namespace)::test_color<color<unsigned_int,3u>>(input_02,output_04);
  (anonymous_namespace)::test_color<color<unsigned_char,2u>>
            ((color<unsigned_char,_2U>)0x0,(color<unsigned_char,_2U>)0x2525);
  (anonymous_namespace)::test_color<color<unsigned_char,2u>>
            ((color<unsigned_char,_2U>)0xffff,(color<unsigned_char,_2U>)0xdada);
  (anonymous_namespace)::test_color<color<unsigned_char,2u>>
            ((color<unsigned_char,_2U>)0xbf1f,(color<unsigned_char,_2U>)0xc615);
  (anonymous_namespace)::test_color<color<unsigned_short,2u>>
            ((color<unsigned_short,_2U>)0x0,(color<unsigned_short,_2U>)0x257d257d);
  (anonymous_namespace)::test_color<color<unsigned_short,2u>>
            ((color<unsigned_short,_2U>)0xffffffff,(color<unsigned_short,_2U>)0xda82da82);
  (anonymous_namespace)::test_color<color<unsigned_short,2u>>
            ((color<unsigned_short,_2U>)0xbf001f,(color<unsigned_short,_2U>)0x25b62545);
  (anonymous_namespace)::test_color<color<unsigned_int,2u>>
            ((color<unsigned_int,_2U>)0x0,(color<unsigned_int,_2U>)0x257d8680257d8680);
  (anonymous_namespace)::test_color<color<unsigned_int,2u>>
            ((color<unsigned_int,_2U>)0xffffffffffffffff,(color<unsigned_int,_2U>)0xda827a00da827a00
            );
  (anonymous_namespace)::test_color<color<unsigned_int,2u>>
            ((color<unsigned_int,_2U>)0xbf0000001f,(color<unsigned_int,_2U>)0x257d8680257d8680);
  (anonymous_namespace)::test_color<color<unsigned_char,1u>>
            ((color<unsigned_char,_1U>)0x0,(color<unsigned_char,_1U>)0x0);
  (anonymous_namespace)::test_color<color<unsigned_char,1u>>
            ((color<unsigned_char,_1U>)0xff,(color<unsigned_char,_1U>)0xff);
  (anonymous_namespace)::test_color<color<unsigned_char,1u>>
            ((color<unsigned_char,_1U>)0x1f,(color<unsigned_char,_1U>)0xff);
  (anonymous_namespace)::test_color<color<unsigned_short,1u>>
            ((color<unsigned_short,_1U>)0x0,(color<unsigned_short,_1U>)0x0);
  (anonymous_namespace)::test_color<color<unsigned_short,1u>>
            ((color<unsigned_short,_1U>)0xffff,(color<unsigned_short,_1U>)0xffff);
  (anonymous_namespace)::test_color<color<unsigned_short,1u>>
            ((color<unsigned_short,_1U>)0x1f,(color<unsigned_short,_1U>)0xffff);
  (anonymous_namespace)::test_color<color<unsigned_int,1u>>
            ((color<unsigned_int,_1U>)0x0,(color<unsigned_int,_1U>)0x0);
  (anonymous_namespace)::test_color<color<unsigned_int,1u>>
            ((color<unsigned_int,_1U>)0xffffffff,(color<unsigned_int,_1U>)0xffffffff);
  (anonymous_namespace)::test_color<color<unsigned_int,1u>>
            ((color<unsigned_int,_1U>)0x1f,(color<unsigned_int,_1U>)0xffffffff);
  return;
}

Assistant:

void test_by_channel( const uint32_t min_res[], const uint32_t max_res[],
    const uint32_t some_res8[], const uint32_t some_res16[], const uint32_t some_res32[]) {
    {
        color<uint8_t, componentCount> c8i{(uint8_t)min_val, (uint8_t)min_val, (uint8_t)min_val, (uint8_t)min_val};
        color<uint8_t, componentCount> c8o{(uint8_t)min_res[0], (uint8_t)min_res[0], (uint8_t)min_res[0], 0};
        test_color(c8i, c8o);
    }
    {
        color<uint8_t, componentCount> c8i{(uint8_t)max_val[0], (uint8_t)max_val[0], (uint8_t)max_val[0], (uint8_t)max_val[0]};
        color<uint8_t, componentCount> c8o{(uint8_t)max_res[0], (uint8_t)max_res[0], (uint8_t)max_res[0], (uint8_t)max_val[0]};
        test_color(c8i, c8o);
    }
    {
        color<uint8_t, componentCount> c8i{(uint8_t)some_val[0], (uint8_t)some_val[1], (uint8_t)some_val[2], 0};
        color<uint8_t, componentCount> c8o{(uint8_t)some_res8[0], (uint8_t)some_res8[1], (uint8_t)some_res8[2], 0};
        test_color(c8i, c8o);
    }
    {
        color<uint16_t, componentCount> c16i{(uint16_t)min_val, (uint16_t)min_val, (uint16_t)min_val, (uint16_t)min_val};
        color<uint16_t, componentCount> c16o{(uint16_t)min_res[1], (uint16_t)min_res[1], (uint16_t)min_res[1], 0};
        test_color(c16i, c16o);
    }
    {
        color<uint16_t, componentCount> c16i{(uint16_t)max_val[1], (uint16_t)max_val[1], (uint16_t)max_val[1], (uint16_t)max_val[1]};
        color<uint16_t, componentCount> c16o{(uint16_t)max_res[1], (uint16_t)max_res[1], (uint16_t)max_res[1], (uint16_t)max_val[1]};
        test_color(c16i, c16o);
    }
    {
        color<uint16_t, componentCount> c16i{(uint16_t)some_val[0], (uint16_t)some_val[1], (uint16_t)some_val[2], 0};
        color<uint16_t, componentCount> c16o{(uint16_t)some_res16[0], (uint16_t)some_res16[1], (uint16_t)some_res16[2], 0};
        test_color(c16i, c16o);
    }
    {
        color<uint32_t, componentCount> c32i{(uint32_t)min_val, (uint32_t)min_val, (uint32_t)min_val, (uint32_t)min_val};
        color<uint32_t, componentCount> c32o{(uint32_t)min_res[2], (uint32_t)min_res[2], (uint32_t)min_res[2], 0};
        test_color(c32i, c32o);
    }
    {
        color<uint32_t, componentCount> c32i{(uint32_t)max_val[2], (uint32_t)max_val[2], (uint32_t)max_val[2], (uint32_t)max_val[2]};
        color<uint32_t, componentCount> c32o{(uint32_t)max_res[2], (uint32_t)max_res[2], (uint32_t)max_res[2], (uint32_t)max_val[2]};
        test_color(c32i, c32o);
    }
    {
        color<uint32_t, componentCount> c32i{(uint32_t)some_val[0], (uint32_t)some_val[1], (uint32_t)some_val[2], 0};
        color<uint32_t, componentCount> c32o{(uint32_t)some_res32[0], (uint32_t)some_res32[1], (uint32_t)some_res32[2], 0};
        test_color(c32i, c32o);
    }
}